

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O3

void __thiscall
QComboBoxPrivate::dataChanged(QComboBoxPrivate *this,QModelIndex *topLeft,QModelIndex *bottomRight)

{
  QWidget *this_00;
  QAbstractItemModel *pQVar1;
  char cVar2;
  int iVar3;
  long in_FS_OFFSET;
  QString local_a8;
  QVariant local_90;
  QModelIndex local_70;
  undefined1 *local_58;
  anon_union_24_3_e3d07ef4_for_data aStack_50;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->field_0x34c & 8) == 0) {
    this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    pQVar1 = (topLeft->m).ptr;
    if (pQVar1 == (QAbstractItemModel *)0x0) {
      local_70._0_8_ = (code *)0xffffffffffffffff;
      local_70.i = 0;
      local_70.m.ptr = (QAbstractItemModel *)0x0;
    }
    else {
      (**(code **)(*(long *)pQVar1 + 0x68))(&local_70,pQVar1,topLeft);
    }
    cVar2 = comparesEqual(&this->root,&local_70);
    if (cVar2 != '\0') {
      if (this->sizeAdjustPolicy == AdjustToContents) {
        (this->sizeHint).wd = -1;
        (this->sizeHint).ht = -1;
        adjustComboBoxSize(this);
        QWidget::updateGeometry(this_00);
      }
      iVar3 = QPersistentModelIndex::row();
      if (topLeft->r <= iVar3) {
        iVar3 = QPersistentModelIndex::row();
        if (iVar3 <= bottomRight->r) {
          local_a8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_a8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_a8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          iVar3 = QPersistentModelIndex::row();
          QComboBox::itemText(&local_a8,(QComboBox *)this_00,iVar3);
          if (this->lineEdit == (QLineEdit *)0x0) {
            updateCurrentText(this,&local_a8);
          }
          else {
            QLineEdit::setText(this->lineEdit,&local_a8);
            updateLineEditGeometry(this);
          }
          QWidget::update(this_00);
          local_38 = &DAT_aaaaaaaaaaaaaaaa;
          aStack_50._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          aStack_50._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_58 = &DAT_aaaaaaaaaaaaaaaa;
          aStack_50.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
          local_70.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
          local_70.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          ::QVariant::QVariant(&local_90,(QString *)&local_a8);
          local_70.i._0_4_ = 0x80c1;
          local_58 = (undefined1 *)CONCAT44(local_58._4_4_,0xffffffff);
          local_70._0_8_ = QTextDocument::setMarkdown;
          local_70.m.ptr = (QAbstractItemModel *)this_00;
          ::QVariant::QVariant((QVariant *)&aStack_50,&local_90);
          local_70.i = CONCAT44(local_70.i._4_4_,0x800e);
          ::QVariant::~QVariant(&local_90);
          QAccessible::updateAccessibility((QAccessibleEvent *)&local_70);
          QAccessibleValueChangeEvent::~QAccessibleValueChangeEvent
                    ((QAccessibleValueChangeEvent *)&local_70);
          if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivate::dataChanged(const QModelIndex &topLeft, const QModelIndex &bottomRight)
{
    Q_Q(QComboBox);
    if (inserting || topLeft.parent() != root)
        return;

    if (sizeAdjustPolicy == QComboBox::AdjustToContents) {
        sizeHint = QSize();
        adjustComboBoxSize();
        q->updateGeometry();
    }

    if (currentIndex.row() >= topLeft.row() && currentIndex.row() <= bottomRight.row()) {
        const QString text = q->itemText(currentIndex.row());
        if (lineEdit) {
            lineEdit->setText(text);
            updateLineEditGeometry();
        } else {
            updateCurrentText(text);
        }
        q->update();
#if QT_CONFIG(accessibility)
        QAccessibleValueChangeEvent event(q, text);
        QAccessible::updateAccessibility(&event);
#endif
    }
}